

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::ProgramStateCase::test(ProgramStateCase *this)

{
  ostringstream *this_00;
  TestLog *log;
  RenderContext *renderCtx;
  TestLog *log_00;
  Shader *this_01;
  Shader *this_02;
  ShaderAllocator *shaders_00;
  char *__to;
  char *__from;
  uchar *in_R8;
  size_t in_R9;
  Program program;
  ShaderAllocator shaders;
  ConstantShaderGenerator sourceGen;
  ProgramInfo programInfo;
  Program PStack_248;
  ShaderAllocator local_208;
  SourceGenerator local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  log = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  local_208.m_srcGen = &local_1c8;
  local_1c8._vptr_SourceGenerator = (_func_int **)&PTR__ConstantShaderGenerator_0078a488;
  local_1c0._0_4_ = (this->m_rnd).m_rnd.x;
  local_1c0._4_4_ = (this->m_rnd).m_rnd.y;
  uStack_1b8._0_4_ = (this->m_rnd).m_rnd.z;
  uStack_1b8._4_4_ = (this->m_rnd).m_rnd.w;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208.m_context = renderCtx;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::Program::Program(&PStack_248,renderCtx);
  log_00 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = anon_unknown_0::ShaderAllocator::createShader(&local_208,SHADERTYPE_VERTEX);
  this_02 = anon_unknown_0::ShaderAllocator::createShader(&local_208,SHADERTYPE_FRAGMENT);
  glu::Shader::compile(this_01);
  glu::Shader::compile(this_02);
  glu::Program::attachShader(&PStack_248,this_01->m_shader);
  __from = (char *)(ulong)this_02->m_shader;
  glu::Program::attachShader(&PStack_248,this_02->m_shader);
  glu::Program::link(&PStack_248,__from,__to);
  shaders_00 = &local_208;
  anon_unknown_0::logProgram
            (log_00,((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx,&PStack_248,
             shaders_00);
  if (PStack_248.m_info.linkOk == true) {
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,PStack_248.m_info.infoLog._M_dataplus._M_p,
               PStack_248.m_info.infoLog._M_dataplus._M_p +
               PStack_248.m_info.infoLog._M_string_length);
    local_1a0[2].m_log._0_1_ = PStack_248.m_info.linkOk;
    local_1a0[2].m_log._1_3_ = PStack_248.m_info._33_3_;
    local_1a0[2].m_log._4_4_ = PStack_248.m_info._36_4_;
    local_1a0[3].m_log._0_4_ = (undefined4)PStack_248.m_info.linkTimeUs;
    local_1a0[3].m_log._4_4_ = PStack_248.m_info.linkTimeUs._4_4_;
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,&PStack_248,&local_208);
    verify(this,(EVP_PKEY_CTX *)&PStack_248,local_1b0,(size_t)shaders_00,in_R8,in_R9);
    anon_unknown_0::logProgram(log,renderCtx,&PStack_248,&local_208);
    if ((TestLog *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
    }
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Fail, couldn\'t link program.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Linking failed");
  }
  glu::Program::~Program(&PStack_248);
  anon_unknown_0::ShaderAllocator::~ShaderAllocator(&local_208);
  return;
}

Assistant:

void ProgramStateCase::test (void)
{
	TestLog&				log			= m_testCtx.getLog();
	glu::RenderContext&		renderCtx	= m_context.getRenderContext();

	ConstantShaderGenerator	sourceGen	(m_rnd);

	ShaderAllocator			shaders		(renderCtx, sourceGen);
	glu::Program			program		(renderCtx);

	buildProgram(program, shaders);

	if (program.getLinkStatus())
	{
		glu::ProgramInfo programInfo = program.getInfo();

		executeForProgram(program, shaders);

		verify(program, programInfo);

		logProgram(log, renderCtx, program, shaders);
	}
	else
	{
		log << TestLog::Message << "Fail, couldn't link program." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}
}